

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revert_list.cpp
# Opt level: O3

ListNode * revert_list(ListNode *head)

{
  ListNode *pLVar1;
  ListNode *pLVar2;
  ListNode *pLVar3;
  
  if (head != (ListNode *)0x0) {
    pLVar3 = (ListNode *)0x0;
    do {
      pLVar2 = head;
      pLVar1 = head->next;
      head->next = pLVar3;
      pLVar3 = head;
      head = pLVar1;
    } while (pLVar1 != (ListNode *)0x0);
    return pLVar2;
  }
  return (ListNode *)0x0;
}

Assistant:

ListNode* revert_list(ListNode* head)
{
	ListNode* prev = nullptr;
	ListNode* next = nullptr;

	while (head) {
		// hanle current node
		next = head->next;
		head->next = prev;

		// move to next node
		prev = head;
		head = next;
	}

	return prev;
}